

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_world(parser *p)

{
  level **pplVar1;
  char *pcVar2;
  int iVar3;
  level *plVar4;
  level *plVar5;
  
  plVar5 = world;
  if (world != (level *)0x0) {
    do {
      pcVar2 = plVar5->up;
      plVar4 = world;
      if (pcVar2 != (char *)0x0) {
        for (; plVar4 != (level *)0x0; plVar4 = plVar4->next) {
          iVar3 = strcmp(pcVar2,plVar4->name);
          if (iVar3 == 0) goto LAB_00158851;
        }
        quit_fmt("Invalid level reference %s",pcVar2);
      }
LAB_00158851:
      pcVar2 = plVar5->down;
      plVar4 = world;
      if (pcVar2 != (char *)0x0) {
        for (; plVar4 != (level *)0x0; plVar4 = plVar4->next) {
          iVar3 = strcmp(pcVar2,plVar4->name);
          if (iVar3 == 0) goto LAB_00158886;
        }
        quit_fmt("Invalid level reference %s",pcVar2);
      }
LAB_00158886:
      pplVar1 = &plVar5->next;
      plVar5 = *pplVar1;
    } while (*pplVar1 != (level *)0x0);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_world(struct parser *p) {
	struct level *level_check;

	/* Check that all levels referred to exist */
	for (level_check = world; level_check; level_check = level_check->next) {
		struct level *level_find = world;

		/* Check upwards */
		if (level_check->up) {
			while (level_find && !streq(level_check->up, level_find->name)) {
				level_find = level_find->next;
			}
			if (!level_find) {
				quit_fmt("Invalid level reference %s", level_check->up);
			}
		}

		/* Check downwards */
		level_find = world;
		if (level_check->down) {
			while (level_find && !streq(level_check->down, level_find->name)) {
				level_find = level_find->next;
			}
			if (!level_find) {
				quit_fmt("Invalid level reference %s", level_check->down);
			}
		}
	}

	parser_destroy(p);
	return 0;
}